

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O3

ZCC_OpProto * __thiscall
ZCCCompiler::PromoteBinary
          (ZCCCompiler *this,EZCCExprType op,ZCC_Expression **left,ZCC_Expression **right)

{
  ZCC_ExprConstant *pZVar1;
  ZCC_Expression **ppZVar2;
  ZCC_OpProto *pZVar3;
  long lVar4;
  long lVar5;
  int route2len;
  int route1len;
  Conversion *route2 [8];
  Conversion *route1 [8];
  int local_c8;
  int local_c4;
  ZCC_Expression **local_c0;
  Conversion *local_b8 [8];
  Conversion *local_78 [9];
  
  if (((*left)->Type == &TypeError->super_PType) || ((*right)->Type == &TypeError->super_PType)) {
    pZVar3 = (ZCC_OpProto *)0x0;
  }
  else {
    local_c4 = 8;
    local_c8 = 8;
    pZVar3 = ZCC_OpInfoType::FindBestProto
                       (ZCC_OpInfo + op,(*left)->Type,local_78,&local_c4,(*right)->Type,local_b8,
                        &local_c8);
    if (pZVar3 != (ZCC_OpProto *)0x0) {
      pZVar1 = (ZCC_ExprConstant *)*left;
      lVar5 = (long)local_c4;
      local_c0 = right;
      if (0 < lVar5) {
        lVar4 = 0;
        do {
          if ((pZVar1->super_ZCC_Expression).Operation == PEX_ConstValue) {
            (*local_78[lVar4]->ConvertConstant)(pZVar1,&this->AST->Strings);
          }
          lVar4 = lVar4 + 1;
        } while (lVar5 != lVar4);
      }
      ppZVar2 = local_c0;
      *left = (ZCC_Expression *)pZVar1;
      pZVar1 = (ZCC_ExprConstant *)*local_c0;
      lVar5 = (long)local_c8;
      if (0 < lVar5) {
        lVar4 = 0;
        do {
          if ((pZVar1->super_ZCC_Expression).Operation == PEX_ConstValue) {
            (*local_b8[lVar4]->ConvertConstant)(pZVar1,&this->AST->Strings);
          }
          lVar4 = lVar4 + 1;
        } while (lVar5 != lVar4);
      }
      *ppZVar2 = (ZCC_Expression *)pZVar1;
    }
  }
  return pZVar3;
}

Assistant:

ZCC_OpProto *ZCCCompiler::PromoteBinary(EZCCExprType op, ZCC_Expression *&left, ZCC_Expression *&right)
{
	// If either operand is of type 'error', the result is also 'error'
	if (left->Type == TypeError || right->Type == TypeError)
	{
		return NULL;
	}
	const PType::Conversion *route1[CONVERSION_ROUTE_SIZE], *route2[CONVERSION_ROUTE_SIZE];
	int route1len = countof(route1), route2len = countof(route2);
	ZCC_OpProto *proto = ZCC_OpInfo[op].FindBestProto(left->Type, route1, route1len, right->Type, route2, route2len);
	if (proto != NULL)
	{
		left = ApplyConversion(left, route1, route1len);
		right = ApplyConversion(right, route2, route2len);
	}
	return proto;
}